

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void Console::SetTextColor(Stream stream,Color color,bool bold)

{
  undefined8 *puVar1;
  undefined3 in_register_00000011;
  char command [8];
  undefined1 local_8 [4];
  undefined4 uStack_4;
  
  if (CONCAT31(in_register_00000011,bold) == 0) {
    _local_8 = CONCAT44(0x6d006d,CONCAT13(ansi_color_map[(long)(int)color * 4] + '0',0x335b1b));
  }
  else {
    _local_8 = CONCAT26(0x6d,CONCAT15(ansi_color_map[(long)(int)color * 4] + '0',0x333b315b1b));
  }
  if (stream == STREAM_OUT) {
    puVar1 = (undefined8 *)&stdout;
  }
  else {
    puVar1 = (undefined8 *)&stderr;
  }
  fputs(local_8,(FILE *)*puVar1);
  return;
}

Assistant:

void SetTextColor(Stream stream, Color color, bool bold)
{
	char command[8] = {27, '[', '1', ';', '3', '0', 'm', 0};

	if (bold)
	{
		command[5] += ansi_color_map[static_cast<int>(color)];
	}
	else
	{
		for (int i = 2; i < 6; ++i)
			command[i] = command[i + 2];

		command[3] += ansi_color_map[static_cast<int>(color)];
	}

	std::fputs(command, (stream == STREAM_OUT) ? stdout : stderr);
}